

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_todo.cpp
# Opt level: O0

void __thiscall Am_Window_ToDo::Remove(Am_Window_ToDo *this)

{
  Am_Window_ToDo *this_local;
  
  if (((this->prev != (Am_Window_ToDo *)0x0) || (this->next != (Am_Window_ToDo *)0x0)) ||
     (Window_ToDo_Head == this)) {
    if (this->next == (Am_Window_ToDo *)0x0) {
      Window_ToDo_Tail = this->prev;
    }
    else {
      this->next->prev = this->prev;
    }
    if (this->prev == (Am_Window_ToDo *)0x0) {
      Window_ToDo_Head = this->next;
    }
    else {
      this->prev->next = this->next;
    }
    this->prev = (Am_Window_ToDo *)0x0;
    this->next = (Am_Window_ToDo *)0x0;
  }
  return;
}

Assistant:

void
Am_Window_ToDo::Remove()
{
  if (prev || next || (Window_ToDo_Head == this)) {
    if (next)
      next->prev = prev;
    else
      Window_ToDo_Tail = prev;
    if (prev)
      prev->next = next;
    else
      Window_ToDo_Head = next;
    prev = nullptr;
    next = nullptr;
  }
}